

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location.hh
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
tchecker::parsing::system::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *ostr,position *pos)

{
  filename_type *pfVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  undefined8 uStack_18;
  
  pfVar1 = pos->filename;
  uStack_18 = in_RAX;
  if (pfVar1 != (filename_type *)0x0) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (ostr,(pfVar1->_M_dataplus)._M_p,pfVar1->_M_string_length);
    uStack_18._0_7_ = CONCAT16(0x3a,(undefined6)uStack_18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_18 + 6),1);
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)ostr,pos->line);
  uStack_18 = CONCAT17(0x2e,(undefined7)uStack_18);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)((long)&uStack_18 + 7),1);
  pbVar3 = (basic_ostream<char,_std::char_traits<char>_> *)
           std::ostream::operator<<((ostream *)poVar2,pos->column);
  return pbVar3;
}

Assistant:

std::basic_ostream<YYChar>&
  operator<< (std::basic_ostream<YYChar>& ostr, const position& pos)
  {
    if (pos.filename)
      ostr << *pos.filename << ':';
    return ostr << pos.line << '.' << pos.column;
  }